

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O0

void __thiscall HMISong::CheckCaps(HMISong *this,int tech)

{
  bool bVar1;
  bool local_2a;
  uint local_1c;
  int local_18;
  uint j;
  int i;
  int tech_local;
  HMISong *this_local;
  
  if (tech == 4) {
    j = 0xa009;
  }
  else if (tech == 1) {
    j = 0xa001;
  }
  else {
    j = 0xa008;
  }
  local_18 = 0;
  do {
    if (this->NumTracks <= local_18) {
      return;
    }
    this->Tracks[local_18].Enabled = false;
    local_1c = 0;
    while( true ) {
      bVar1 = false;
      if (local_1c < 8) {
        bVar1 = this->Tracks[local_18].Designation[local_1c] != 0;
      }
      if (!bVar1) break;
      if (this->Tracks[local_18].Designation[local_1c] == j) {
        this->Tracks[local_18].Enabled = true;
      }
      else if (this->Tracks[local_18].Designation[local_1c] == 0xa000) {
        local_2a = j == 0xa001 || j == 0xa008;
        this->Tracks[local_18].Enabled = local_2a;
      }
      else if (this->Tracks[local_18].Designation[local_1c] == 0xa002) {
        this->Tracks[local_18].Enabled = j == 0xa009;
      }
      if ((this->Tracks[local_18].Enabled & 1U) != 0) break;
      local_1c = local_1c + 1;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void HMISong::CheckCaps(int tech)
{
	// What's the equivalent HMI device for our technology?
	if (tech == MOD_FMSYNTH)
	{
		tech = HMI_DEV_OPL3;
	}
	else if (tech == MOD_MIDIPORT)
	{
		tech = HMI_DEV_MPU401;
	}
	else
	{ // Good enough? Or should we just say we're GM.
		tech = HMI_DEV_SBAWE32;
	}

	for (int i = 0; i < NumTracks; ++i)
	{
		Tracks[i].Enabled = false;
		// Track designations are stored in a 0-terminated array.
		for (unsigned int j = 0; j < countof(Tracks[i].Designation) && Tracks[i].Designation[j] != 0; ++j)
		{
			if (Tracks[i].Designation[j] == tech)
			{
				Tracks[i].Enabled = true;
			}
			// If a track is designated for device 0xA000, it will be played by a MIDI
			// driver for device types 0xA000, 0xA001, and 0xA008. Why this does not
			// include the GUS, I do not know.
			else if (Tracks[i].Designation[j] == HMI_DEV_GM)
			{
				Tracks[i].Enabled = (tech == HMI_DEV_MPU401 || tech == HMI_DEV_SBAWE32);
			}
			// If a track is designated for device 0xA002, it will be played by a MIDI
			// driver for device types 0xA002 or 0xA009.
			else if (Tracks[i].Designation[j] == HMI_DEV_OPL2)
			{
				Tracks[i].Enabled = (tech == HMI_DEV_OPL3);
			}
			// Any other designation must match the specific MIDI driver device number.
			// (Which we handled first above.)

			if (Tracks[i].Enabled)
			{ // This track's been enabled, so we can stop checking other designations.
				break;
			}
		}
	}
}